

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O2

unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> __thiscall
pfederc::Parser::parseFunctionBody(Parser *this)

{
  TokenType TVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  reference pvVar5;
  Token *pTVar6;
  Parser *in_RSI;
  ReturnControlType rct;
  undefined1 local_a8 [14];
  undefined2 local_9a;
  uint local_98;
  undefined4 local_94;
  tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_> local_90;
  undefined1 local_88 [32];
  Position local_68;
  unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> local_50;
  Exprs exprs;
  
  pTVar6 = in_RSI->lexer->currentToken;
  local_68.line = (pTVar6->pos).line;
  local_68.startIndex = (pTVar6->pos).startIndex;
  local_68.endIndex = (pTVar6->pos).endIndex;
  exprs.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  exprs.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  exprs.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = 0;
  local_90.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
       (_Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)this;
LAB_001120c3:
  do {
    bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_KW_RET);
    if ((((!bVar4) || (bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT), !bVar4)) ||
        (bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), !bVar4)) ||
       (bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_KW_ELSE), !bVar4)) {
      local_a8._0_8_ = (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
      rct = NONE;
      bVar4 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_RET);
      if (((bVar4) || (bVar4 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_CTN), bVar4)) ||
         (bVar4 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_BRK), bVar4)) {
        pTVar6 = in_RSI->lexer->currentToken;
        TVar1 = pTVar6->type;
        if (TVar1 == TOK_KW_BRK) {
          rct = BREAK;
        }
        else if (TVar1 == TOK_KW_CTN) {
          rct = CONTINUE;
        }
        else if (TVar1 == TOK_KW_RET) {
          rct = RETURN;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_88,"Return control is neither ret, ctn or brk.",
                     (allocator<char> *)&local_9a);
          fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_func.cpp"
                ,0x163,(string *)local_88);
          std::__cxx11::string::~string((string *)local_88);
          pTVar6 = in_RSI->lexer->currentToken;
        }
        Position::operator+(&local_68,&pTVar6->pos);
        local_68.endIndex = local_88._16_8_;
        local_68.line = local_88._0_8_;
        local_68.startIndex = local_88._8_8_;
        Lexer::next(in_RSI->lexer);
        if ((rct != RETURN) &&
           (((bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), !bVar4 ||
             (bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOL), !bVar4)) ||
            (bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT), !bVar4))))
        goto LAB_001124b8;
        parseExpression((Parser *)local_88,(Precedence)in_RSI);
        uVar3 = local_88._0_8_;
        uVar2 = local_a8._0_8_;
        local_88._0_8_ =
             (__uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              )0x0;
        local_a8._0_8_ = uVar3;
        if (((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)uVar2 !=
             (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) &&
           ((**(code **)(*(long *)uVar2 + 8))(),
           (_Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>)local_88._0_8_ !=
           (_Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>)0x0)) {
          (**(code **)(*(long *)local_88._0_8_ + 8))();
        }
        if ((_Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>)uVar3 !=
            (_Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>)0x0) {
          Position::operator+(&local_68,(Position *)(uVar3 + 0x20));
          local_68.endIndex = local_88._16_8_;
          local_68.line = local_88._0_8_;
          local_68.startIndex = local_88._8_8_;
          goto LAB_001124b8;
        }
        skipEol(in_RSI);
LAB_001124f2:
        ((Expr *)local_90.
                 super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                 .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl)->_vptr_Expr =
             (_func_int **)0x0;
      }
      else {
LAB_001124b8:
        skipEol(in_RSI);
        if ((local_98 & 1) != 0) goto LAB_001124f2;
        std::
        make_unique<pfederc::BodyExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,pfederc::ReturnControlType&>
                  ((Lexer *)local_90.
                            super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                            .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl,
                   (Position *)in_RSI->lexer,
                   (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)&local_68,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&exprs,
                   (ReturnControlType *)local_a8);
      }
      if ((Lexer *)local_a8._0_8_ != (Lexer *)0x0) {
        (*(*(_func_int ***)local_a8._0_8_)[1])();
      }
      goto LAB_0011250b;
    }
    bVar4 = Token::operator==(in_RSI->lexer->currentToken,TOK_EOL);
    if (bVar4) {
      Lexer::next(in_RSI->lexer);
      goto LAB_001120c3;
    }
    parseExpression((Parser *)local_a8,(Precedence)in_RSI);
    bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT);
    if ((bVar4) && (bVar4 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOL), bVar4)) {
      local_9a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
      rct = 0xf;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)local_88,(SyntaxErrorCode *)&local_9a,(Position *)&rct);
      generateError((Parser *)&local_50,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                (&local_50);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)local_88);
      skipToStmtEol(in_RSI);
      local_98 = (uint)CONCAT71(extraout_var,1);
LAB_00112278:
      expect(in_RSI,TOK_EOL);
      if ((Lexer *)local_a8._0_8_ == (Lexer *)0x0) {
        local_98 = (uint)CONCAT71(extraout_var_00,1);
        goto LAB_001120c3;
      }
      Position::operator+(&local_68,(Position *)(local_a8._0_8_ + 0x20));
      local_68.endIndex = local_88._16_8_;
      local_68.line = local_88._0_8_;
      local_68.startIndex = local_88._8_8_;
      pvVar5 = std::
               vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
               ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                         ((vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                           *)&exprs,
                          (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_a8
                         );
      if ((Lexer *)local_a8._0_8_ == (Lexer *)0x0) goto LAB_001120c3;
      local_94 = (undefined4)CONCAT71((int7)((ulong)pvVar5 >> 8),1);
    }
    else {
      bVar4 = Token::operator==(in_RSI->lexer->currentToken,TOK_STMT);
      if ((!bVar4) || ((Lexer *)local_a8._0_8_ == (Lexer *)0x0)) goto LAB_00112278;
      Position::operator+(&local_68,(Position *)(local_a8._0_8_ + 0x20));
      local_68.endIndex = local_88._16_8_;
      local_68.line = local_88._0_8_;
      local_68.startIndex = local_88._8_8_;
      local_88._0_4_ = 1;
      std::
      make_unique<pfederc::BodyExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,pfederc::ReturnControlType>
                ((Lexer *)local_90.
                          super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                          .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl,
                 (Position *)in_RSI->lexer,
                 (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)&local_68,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&exprs,
                 (ReturnControlType *)local_a8);
      if ((Lexer *)local_a8._0_8_ == (Lexer *)0x0) goto LAB_0011250b;
      local_94 = 0;
    }
    (**(code **)(*(long *)local_a8._0_8_ + 8))();
    if ((char)local_94 == '\0') {
LAB_0011250b:
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector(&exprs);
      return (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>
             )(tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
              local_90.
              super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
              super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
    }
  } while( true );
}

Assistant:

std::unique_ptr<BodyExpr> Parser::parseFunctionBody() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  bool err = false;
  Exprs exprs;
  while (*lexer.getCurrentToken() != TokenType::TOK_KW_RET
      && *lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF
      && *lexer.getCurrentToken() != TokenType::TOK_KW_ELSE) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (*lexer.getCurrentToken() != TokenType::TOK_STMT
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToStmtEol();
      err = true;
    } else if (*lexer.getCurrentToken() == TokenType::TOK_STMT && expr) {
      pos = pos + expr->getPosition();
      // return expression without mentioning return ('expr' ';')
      return std::make_unique<BodyExpr>(lexer, pos,
          std::move(exprs), std::move(expr),
          ReturnControlType::RETURN);
    }

    expect(TokenType::TOK_EOL);

    if (!expr)
      err = true;
    else {
      pos = pos + expr->getPosition();
      exprs.push_back(std::move(expr));
    }
  }

  std::unique_ptr<Expr> returnExpr;
  ReturnControlType rct{ReturnControlType::NONE};
  if (*lexer.getCurrentToken() == TokenType::TOK_KW_RET
      || *lexer.getCurrentToken() == TokenType::TOK_KW_CTN
      || *lexer.getCurrentToken() == TokenType::TOK_KW_BRK) {
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_KW_RET:
      rct = ReturnControlType::RETURN;
      break;
    case TokenType::TOK_KW_CTN:
      rct = ReturnControlType::CONTINUE;
      break;
    case TokenType::TOK_KW_BRK:
      rct = ReturnControlType::BREAK;
      break;
    default:
      fatal(__FILE__, __LINE__, "Return control is neither ret, ctn or brk.");
      break;
    }

    pos = pos + lexer.getCurrentToken()->getPosition();
    lexer.next(); // eat return,ctn,brk

    if (rct == ReturnControlType::RETURN
        || (*lexer.getCurrentToken() != TokenType::TOK_EOF
            && *lexer.getCurrentToken() != TokenType::TOK_EOL
            && *lexer.getCurrentToken() != TokenType::TOK_STMT)) {
      returnExpr = parseExpression();
      if (returnExpr)
        pos = pos + returnExpr->getPosition();
      else
        err = true;
    }
  }

  skipEol();

  if (err)
    return nullptr;

  return std::make_unique<BodyExpr>(lexer,
    pos, std::move(exprs), std::move(returnExpr), rct);
}